

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2cell_id.cc
# Opt level: O2

S2CellId __thiscall S2CellId::FromDebugString(S2CellId *this,string_view str)

{
  byte bVar1;
  int i;
  char *pcVar2;
  S2CellId id;
  
  if ((int)str.ptr_ - 0x21U < 0xffffffe1) {
    return (S2CellId)0;
  }
  bVar1 = (byte)this->id_;
  if (((byte)(bVar1 - 0x36) < 0xfa) || (*(char *)((long)&this->id_ + 1) != '/')) {
LAB_0021d8b0:
    id.id_ = 0;
  }
  else {
    id.id_ = (ulong)bVar1 << 0x3d | 0x1000000000000000;
    for (pcVar2 = (char *)0x2; pcVar2 < str.ptr_; pcVar2 = pcVar2 + 1) {
      if ((pcVar2[(long)&this->id_] & 0xfcU) != 0x30) goto LAB_0021d8b0;
      id = child(&id,(byte)pcVar2[(long)&this->id_] - 0x30);
    }
  }
  return (S2CellId)id.id_;
}

Assistant:

S2CellId S2CellId::FromDebugString(absl::string_view str) {
  // This function is reasonably efficient, but is only intended for use in
  // tests.
  int level = static_cast<int>(str.size() - 2);
  if (level < 0 || level > S2CellId::kMaxLevel) return S2CellId::None();
  int face = str[0] - '0';
  if (face < 0 || face > 5 || str[1] != '/') return S2CellId::None();
  S2CellId id = S2CellId::FromFace(face);
  for (int i = 2; i < str.size(); ++i) {
    int child_pos = str[i] - '0';
    if (child_pos < 0 || child_pos > 3) return S2CellId::None();
    id = id.child(child_pos);
  }
  return id;
}